

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_access.c
# Opt level: O1

void ecs_table_delete_column
               (ecs_world_t *world,ecs_table_t *table,int32_t column,ecs_vector_t *vector)

{
  short sVar1;
  ecs_c_info_t *peVar2;
  ecs_xtor_t p_Var3;
  ecs_entity_t eVar4;
  int16_t offset;
  int32_t iVar5;
  ecs_column_t *peVar6;
  ecs_entity_t *peVar7;
  void *pvVar8;
  size_t sVar9;
  
  if (vector == (ecs_vector_t *)0x0) {
    peVar6 = da_get_column(table,column);
    if (peVar6 == (ecs_column_t *)0x0) {
      vector = (ecs_vector_t *)0x0;
    }
    else {
      vector = peVar6->data;
    }
    if (vector == (ecs_vector_t *)0x0) {
      return;
    }
    _ecs_assert(table->data != (ecs_data_t *)0x0,0xc,(char *)0x0,"table->data != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0xe4);
    if (table->data == (ecs_data_t *)0x0) {
      __assert_fail("table->data != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                    ,0xe4,
                    "void ecs_table_delete_column(ecs_world_t *, ecs_table_t *, int32_t, ecs_vector_t *)"
                   );
    }
    _ecs_assert(table->data->columns != (ecs_column_t *)0x0,0xc,(char *)0x0,
                "table->data->columns != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                ,0xe5);
    peVar6 = table->data->columns;
    if (peVar6 == (ecs_column_t *)0x0) {
      __assert_fail("table->data->columns != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/addons/direct_access.c"
                    ,0xe5,
                    "void ecs_table_delete_column(ecs_world_t *, ecs_table_t *, int32_t, ecs_vector_t *)"
                   );
    }
    peVar6[column].data = (ecs_vector_t *)0x0;
  }
  peVar6 = da_get_or_create_column(world,table,column);
  ecs_vector_assert_size(vector,(int)peVar6->size);
  peVar2 = table->c_info[column];
  if ((peVar2 != (ecs_c_info_t *)0x0) &&
     (p_Var3 = (peVar2->lifecycle).dtor, p_Var3 != (ecs_xtor_t)0x0)) {
    peVar7 = get_entity_array(table,0);
    sVar1 = peVar6->alignment;
    iVar5 = ecs_vector_count(vector);
    offset = 0x10;
    if (0x10 < sVar1) {
      offset = sVar1;
    }
    pvVar8 = _ecs_vector_first(vector,(int)peVar6->size,offset);
    eVar4 = peVar2->component;
    sVar9 = ecs_to_size_t((long)peVar6->size);
    (*p_Var3)(world,eVar4,peVar7,pvVar8,sVar9,iVar5,(peVar2->lifecycle).ctx);
  }
  if (peVar6->data == vector) {
    peVar6->data = (ecs_vector_t *)0x0;
  }
  ecs_vector_free(vector);
  return;
}

Assistant:

void ecs_table_delete_column(
    ecs_world_t *world,
    ecs_table_t *table,
    int32_t column,
    ecs_vector_t *vector)
{
    if (!vector) {
        vector = ecs_table_get_column(table, column);
        if (!vector) {
            return;
        }

        ecs_assert(table->data != NULL, ECS_INTERNAL_ERROR, NULL);
        ecs_assert(table->data->columns != NULL, ECS_INTERNAL_ERROR, NULL);

        table->data->columns[column].data = NULL;
    }

    ecs_column_t *c = da_get_or_create_column(world, table, column);
    ecs_vector_assert_size(vector, c->size);

    ecs_c_info_t *c_info = table->c_info[column];
    ecs_xtor_t dtor;
    if (c_info && (dtor = c_info->lifecycle.dtor)) {
        ecs_entity_t *entities = get_entity_array(table, 0);
        int16_t alignment = c->alignment;
        int32_t count = ecs_vector_count(vector);
        void *ptr = ecs_vector_first_t(vector, c->size, alignment);
        dtor(world, c_info->component, entities, ptr, ecs_to_size_t(c->size), 
            count, c_info->lifecycle.ctx);
    }

    if (c->data == vector) {
        c->data = NULL;
    }

    ecs_vector_free(vector);
}